

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O2

void skiwi::store_registers(asmcode *code)

{
  operand oVar1;
  operation oVar2;
  operand local_40;
  operation local_3c;
  operand local_38;
  operation local_34;
  
  local_34 = MOV;
  local_3c = ADD;
  oVar1 = MEM_R10;
  local_40 = RBX;
  local_38 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_34 = MOV;
  local_3c = CMPLEPD;
  local_40 = RDI;
  local_38 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_34 = MOV;
  local_3c = EXTERN;
  local_40 = RSI;
  local_38 = oVar1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  oVar2 = MOV;
  local_38 = MEM_R10;
  local_3c = FLDLN2;
  local_40 = RSP;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_38 = MEM_R10;
  local_3c = FSCALE;
  local_40 = RBP;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_38 = MEM_R10;
  local_3c = GLOBAL;
  local_40 = R12;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_38 = MEM_R10;
  local_3c = JL;
  local_40 = R13;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_38 = MEM_R10;
  local_3c = JES;
  local_40 = R14;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  local_38 = MEM_R10;
  local_40 = R15;
  local_3c = oVar2;
  local_34 = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_34,&local_38,(int *)&local_3c,&local_40);
  return;
}

Assistant:

void store_registers(asmcode& code)
  {
  /*
  linux: r12, r13, r14, r15, rbx, rsp, rbp should be preserved
  windows: r12, r13, r14, r15, rbx, rsp, rbp, rdi, rsi
  */
  code.add(asmcode::MOV, RBX_STORE, asmcode::RBX);
  code.add(asmcode::MOV, RDI_STORE, asmcode::RDI);
  code.add(asmcode::MOV, RSI_STORE, asmcode::RSI);
  code.add(asmcode::MOV, RSP_STORE, asmcode::RSP);
  code.add(asmcode::MOV, RBP_STORE, asmcode::RBP);
  code.add(asmcode::MOV, R12_STORE, asmcode::R12);
  code.add(asmcode::MOV, R13_STORE, asmcode::R13);
  code.add(asmcode::MOV, R14_STORE, asmcode::R14);
  code.add(asmcode::MOV, R15_STORE, asmcode::R15);
  }